

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O2

INT16 ymf278b_getSample(YMF278BChip *chip,YMF278BSlot *slot,UINT16 pos)

{
  byte bVar1;
  UINT8 UVar2;
  ushort uVar3;
  UINT32 UVar4;
  
  UVar2 = slot->bits;
  if (UVar2 == '\x02') {
    UVar4 = slot->startaddr;
    bVar1 = ymf278b_readMem(chip,UVar4 + (uint)pos * 2);
    uVar3 = (ushort)bVar1 << 8;
    bVar1 = ymf278b_readMem(chip,UVar4 + (uint)pos * 2 + 1);
  }
  else {
    if (UVar2 != '\x01') {
      if (UVar2 == '\0') {
        bVar1 = ymf278b_readMem(chip,(uint)pos + slot->startaddr);
        return (ushort)bVar1 << 8;
      }
      return 0;
    }
    UVar4 = (uint)(pos >> 1) * 3 + slot->startaddr;
    if ((pos & 1) == 0) {
      bVar1 = ymf278b_readMem(chip,UVar4);
      uVar3 = (ushort)bVar1 << 8;
      UVar2 = ymf278b_readMem(chip,UVar4 + 1);
      bVar1 = UVar2 << 4;
    }
    else {
      bVar1 = ymf278b_readMem(chip,UVar4 + 2);
      uVar3 = (ushort)bVar1 << 8;
      bVar1 = ymf278b_readMem(chip,UVar4 + 1);
      bVar1 = bVar1 & 0xf0;
    }
  }
  return bVar1 | uVar3;
}

Assistant:

INLINE INT16 ymf278b_getSample(YMF278BChip* chip, YMF278BSlot* slot, UINT16 pos)
{
	// TODO How does this behave when R#2 bit 0 = 1?
	//      As-if read returns 0xff? (Like for CPU memory reads.) Or is
	//      sound generation blocked at some higher level?
	INT16 sample;
	UINT32 addr;
	
	switch (slot->bits)
	{
	case 0:
		// 8 bit
		sample = ymf278b_readMem(chip, slot->startaddr + pos) << 8;
		break;
	case 1:
		// 12 bit
		addr = slot->startaddr + ((pos / 2) * 3);
		if (pos & 1)
			sample = (ymf278b_readMem(chip, addr + 2) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0xF0) << 0);
		else
			sample = (ymf278b_readMem(chip, addr + 0) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0x0F) << 4);
		break;
	case 2:
		// 16 bit
		addr = slot->startaddr + (pos * 2);
		sample = (ymf278b_readMem(chip, addr + 0) << 8) | ymf278b_readMem(chip, addr + 1);
		break;
	default:
		// TODO unspecified
		sample = 0;
		break;
	}
	return sample;
}